

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O0

void borg_init_flow(void)

{
  int local_10;
  int local_c;
  wchar_t y;
  wchar_t x;
  
  borg_data_flow = (borg_data *)mem_zalloc(0x330c);
  borg_data_cost = (borg_data *)mem_zalloc(0x330c);
  borg_data_hard = (borg_data *)mem_zalloc(0x330c);
  borg_data_know = (borg_data *)mem_zalloc(0x330c);
  borg_data_icky = (borg_data *)mem_zalloc(0x330c);
  for (local_10 = 0; local_10 < 0x42; local_10 = local_10 + 1) {
    for (local_c = 0; local_c < 0xc6; local_c = local_c + 1) {
      borg_data_hard->data[local_10][local_c] = 0xff;
    }
  }
  borg_init_track(&track_step,L'd');
  borg_init_track(&track_door,L'd');
  borg_init_track(&track_closed,L'd');
  borg_init_flow_stairs();
  borg_init_flow_glyph();
  borg_init_flow_misc();
  return;
}

Assistant:

void borg_init_flow(void)
{
    int x, y;

    /*** Grid data ***/

    /* Allocate */
    borg_data_flow = mem_zalloc(sizeof(borg_data));

    /* Allocate */
    borg_data_cost = mem_zalloc(sizeof(borg_data));

    /* Allocate */
    borg_data_hard = mem_zalloc(sizeof(borg_data));

    /* Allocate */
    borg_data_know = mem_zalloc(sizeof(borg_data));

    /* Allocate */
    borg_data_icky = mem_zalloc(sizeof(borg_data));

    /* Prepare "borg_data_hard" */
    for (y = 0; y < AUTO_MAX_Y; y++) {
        for (x = 0; x < AUTO_MAX_X; x++) {
            /* Prepare "borg_data_hard" */
            borg_data_hard->data[y][x] = 255;
        }
    }

    /* Track Steps */
    borg_init_track(&track_step, 100);

    /* Track doors closed by borg */
    borg_init_track(&track_door, 100);

    /* Track closed doors on map */
    borg_init_track(&track_closed, 100);

    borg_init_flow_stairs();
    borg_init_flow_glyph();
    borg_init_flow_misc();
}